

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O3

void V_UpdateModeSize(int width,int height)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined8 in_RAX;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int cx2;
  int cx1;
  
  _cx2 = in_RAX;
  V_CalcCleanFacs(0x140,200,width,height,&CleanXfac,&CleanYfac,&cx1,&cx2);
  CleanWidth = width / CleanXfac;
  CleanHeight = height / CleanYfac;
  if (CleanWidth < 0x140) {
    __assert_fail("CleanWidth >= 320",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_video.cpp"
                  ,0x52b,"void V_UpdateModeSize(int, int)");
  }
  if (CleanHeight < 200) {
    __assert_fail("CleanHeight >= 200",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_video.cpp"
                  ,0x52c,"void V_UpdateModeSize(int, int)");
  }
  if (width - 0x3c0U < 0xffffff60) {
    if (cx1 < cx2) {
      CleanXfac_1 = cx1;
    }
    else {
      iVar4 = 2;
      if (2 < CleanXfac) {
        iVar4 = CleanXfac;
      }
      uVar3 = iVar4 - 1;
      iVar7 = 2;
      if (2 < CleanYfac) {
        iVar7 = CleanYfac;
      }
      cx1 = iVar7 + -1;
      iVar6 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
      iVar2 = iVar6 * 3;
      iVar6 = iVar6 * 3 + 3;
      if (-1 < iVar2) {
        iVar6 = iVar2;
      }
      CleanXfac_1 = uVar3;
      if ((3 < CleanXfac) && (iVar6 = iVar6 >> 2, iVar6 < (int)(uVar3 * 0x140))) {
        uVar8 = 3;
        if (uVar3 < 3) {
          uVar8 = uVar3;
        }
        uVar5 = ((iVar4 * 0x140 - iVar6) - 0x141U) / 0x140;
        uVar9 = ~uVar8 + iVar4;
        if (uVar5 < ~uVar8 + iVar4) {
          uVar9 = uVar5;
        }
        CleanXfac_1 = (iVar4 - uVar9) + -2;
        cx1 = (iVar7 - uVar9) + -2;
        iVar4 = iVar4 * 0x140 + -0x280;
        do {
          if (uVar3 < 4) break;
          uVar3 = uVar3 - 1;
          bVar1 = iVar6 < iVar4;
          iVar4 = iVar4 + -0x140;
        } while (bVar1);
      }
    }
    CleanWidth_1 = width / CleanXfac_1;
    CleanHeight_1 = height / cx1;
    CleanYfac_1 = cx1;
  }
  else {
    CleanXfac_1 = CleanXfac;
    CleanYfac_1 = CleanYfac;
    CleanHeight_1 = CleanHeight;
    CleanWidth_1 = CleanWidth;
  }
  R_OldBlend = 0xffffffff;
  DisplayWidth = width;
  DisplayHeight = height;
  (*Renderer->_vptr_FRenderer[0xc])();
  return;
}

Assistant:

void V_UpdateModeSize (int width, int height)
{
	int cx1, cx2;
	V_CalcCleanFacs(320, 200, width, height, &CleanXfac, &CleanYfac, &cx1, &cx2);

	CleanWidth = width / CleanXfac;
	CleanHeight = height / CleanYfac;
	assert(CleanWidth >= 320);
	assert(CleanHeight >= 200);

	if (width < 800 || width >= 960)
	{
		if (cx1 < cx2)
		{
			// Special case in which we don't need to scale down.
			CleanXfac_1 = 
			CleanYfac_1 = cx1;
		}
		else
		{
			CleanXfac_1 = MAX(CleanXfac - 1, 1);
			CleanYfac_1 = MAX(CleanYfac - 1, 1);
			// On larger screens this is not enough so make sure it's at most 3/4 of the screen's width
			while (CleanXfac_1 * 320 > screen->GetWidth()*3/4 && CleanXfac_1 > 2)
			{
				CleanXfac_1--;
				CleanYfac_1--;
			}
		}
		CleanWidth_1 = width / CleanXfac_1;
		CleanHeight_1 = height / CleanYfac_1;
	}
	else // if the width is between 800 and 960 the ratio between the screensize and CleanXFac-1 becomes too large.
	{
		CleanXfac_1 = CleanXfac;
		CleanYfac_1 = CleanYfac;
		CleanWidth_1 = CleanWidth;
		CleanHeight_1 = CleanHeight;
	}


	DisplayWidth = width;
	DisplayHeight = height;

	R_OldBlend = ~0;
	Renderer->OnModeSet();
}